

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3DestroyMethod(sqlite3_vtab *pVtab)

{
  undefined8 uVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  int rc;
  
  rc = 0;
  uVar1 = *(undefined8 *)&pVtab[1].nRef;
  pcVar2 = pVtab[1].zErrMsg;
  pcVar4 = "--";
  if (*(long *)&pVtab[3].nRef == 0) {
    pcVar4 = "";
  }
  fts3DbExec(&rc,(sqlite3 *)pVtab[1].pModule,
             "DROP TABLE IF EXISTS %Q.\'%q_segments\';DROP TABLE IF EXISTS %Q.\'%q_segdir\';DROP TABLE IF EXISTS %Q.\'%q_docsize\';DROP TABLE IF EXISTS %Q.\'%q_stat\';%s DROP TABLE IF EXISTS %Q.\'%q_content\';"
             ,uVar1,pcVar2,uVar1,pcVar2,uVar1,pcVar2,uVar1,pcVar2,pcVar4,uVar1,pcVar2);
  iVar3 = rc;
  if (rc == 0) {
    fts3DisconnectMethod(pVtab);
  }
  return iVar3;
}

Assistant:

static int fts3DestroyMethod(sqlite3_vtab *pVtab){
  Fts3Table *p = (Fts3Table *)pVtab;
  int rc = SQLITE_OK;              /* Return code */
  const char *zDb = p->zDb;        /* Name of database (e.g. "main", "temp") */
  sqlite3 *db = p->db;             /* Database handle */

  /* Drop the shadow tables */
  fts3DbExec(&rc, db, 
    "DROP TABLE IF EXISTS %Q.'%q_segments';"
    "DROP TABLE IF EXISTS %Q.'%q_segdir';"
    "DROP TABLE IF EXISTS %Q.'%q_docsize';"
    "DROP TABLE IF EXISTS %Q.'%q_stat';"
    "%s DROP TABLE IF EXISTS %Q.'%q_content';",
    zDb, p->zName,
    zDb, p->zName,
    zDb, p->zName,
    zDb, p->zName,
    (p->zContentTbl ? "--" : ""), zDb,p->zName
  );

  /* If everything has worked, invoke fts3DisconnectMethod() to free the
  ** memory associated with the Fts3Table structure and return SQLITE_OK.
  ** Otherwise, return an SQLite error code.
  */
  return (rc==SQLITE_OK ? fts3DisconnectMethod(pVtab) : rc);
}